

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::ScanLineInputFile::Data::readPixels(Data *this,FrameBuffer *fb,int scanLine1,int scanLine2)

{
  _exr_decode_pipeline *p_Var1;
  exr_chunk_info_t *peVar2;
  mutex *__mutex;
  uint uVar3;
  ScanLineProcess *this_00;
  pointer __dest;
  undefined8 uVar4;
  pointer pSVar5;
  atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*> aVar6;
  atomic<Imf_3_4::(anonymous_namespace)::ScanLineProcess_*> aVar7;
  int iVar8;
  exr_result_t eVar9;
  pointer pSVar10;
  tuple<Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
  __s;
  Task *this_01;
  atomic<Imf_3_4::(anonymous_namespace)::ScanLineProcess_*> aVar11;
  InputExc *this_02;
  char *pcVar12;
  ostream *poVar13;
  ArgExc *pAVar14;
  IoExc *pIVar15;
  vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *filllist;
  code *pcVar16;
  FrameBuffer *outfb;
  __base_type _Var17;
  ulong uVar18;
  undefined *puVar19;
  ScanLineProcess *__cur;
  pointer pSVar20;
  long lVar21;
  ScanLineProcess *__cur_1;
  ulong uVar22;
  bool bVar23;
  exr_attr_box2i_t eVar24;
  int32_t scansperchunk;
  TaskGroup tg;
  exr_chunk_info_t cinfo;
  stringstream _iex_throw_s;
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  ulong local_200;
  int local_1f8;
  undefined4 uStack_1f4;
  int iStack_1f0;
  undefined4 uStack_1ec;
  undefined8 local_1e8;
  uint64_t uStack_1e0;
  uint64_t local_1d8;
  uint64_t uStack_1d0;
  uint64_t local_1c8;
  uint64_t uStack_1c0;
  undefined1 local_1b8 [40];
  __base_type local_190;
  pointer pSStack_188;
  pointer local_180;
  atomic<Imf_3_4::(anonymous_namespace)::ScanLineProcess_*> aStack_178;
  atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_170;
  
  eVar24 = Context::dataWindow(this->_ctxt,this->partNumber);
  iVar8 = exr_get_scanlines_per_chunk
                    (*(this->_ctxt->_ctxt).
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (iVar8 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Error querying scanline counts from image file \"",
               0x30);
    pcVar12 = Context::fileName(this->_ctxt);
    poVar13 = std::operator<<((ostream *)(local_1b8 + 0x10),pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\".",2);
    pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar14,(stringstream *)local_1b8);
    __cxa_throw(pAVar14,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  outfb = (FrameBuffer *)(ulong)(uint)scanLine1;
  if (scanLine2 < scanLine1) {
    outfb = (FrameBuffer *)(ulong)(uint)scanLine2;
  }
  if (scanLine1 < scanLine2) {
    scanLine1 = scanLine2;
  }
  iVar8 = (int)outfb;
  if ((iVar8 < eVar24.min.y) || (eVar24.max.y < scanLine1)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),
               "Tried to read scan line outside the image file\'s data window: ",0x3e);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)(local_1b8 + 0x10),iVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," - ",3);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,scanLine1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," vs datawindow ",0xf);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,eVar24.min.y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," - ",3);
    std::ostream::operator<<((ostream *)poVar13,eVar24.max.y);
    pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar14,(stringstream *)local_1b8);
    __cxa_throw(pAVar14,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if (0 < ((long)scanLine1 - (long)iVar8) / 1) {
    uVar3 = this->numThreads;
    uVar18 = (ulong)(int)uVar3;
    if (1 < (long)uVar18) {
      IlmThread_3_4::Semaphore::Semaphore((Semaphore *)local_1b8,uVar3);
      local_190._M_p = (pointer)0x0;
      pSStack_188 = (pointer)0x0;
      local_180 = (pointer)0x0;
      aStack_178._M_b._M_p = (__base_type)(__pointer_type)0x0;
      local_170._M_b._M_p = (__base_type)(__pointer_type)0x0;
      pSVar10 = (pointer)0x0;
      lVar21 = -uVar18;
      pSVar20 = pSStack_188;
      if ((uVar18 != 0) && (uVar18 != 0)) {
        if (uVar18 == 0) {
          do {
            memset(pSVar10,0,0x248);
            pSVar10->last_decode_err = 0x21;
            pSVar10->first = true;
            pSVar10 = pSVar10 + 1;
            lVar21 = lVar21 + 1;
            pSVar20 = pSVar10;
          } while (lVar21 != 0);
        }
        else {
          if (0x381c0e070381c0 < uVar18) {
            std::__throw_length_error("vector::_M_default_append");
          }
          uVar22 = uVar18;
          if (0x381c0e070381bf < uVar18) {
            uVar22 = 0x381c0e070381c0;
          }
          if (uVar22 == 0) {
            pSVar10 = (pointer)0x0;
          }
          else {
            pSVar10 = (pointer)operator_new(uVar22 * 0x248);
          }
          lVar21 = -uVar18;
          pSVar20 = pSVar10;
          local_200 = uVar22;
          do {
            memset(pSVar20,0,0x248);
            pSVar5 = pSStack_188;
            pSVar20->last_decode_err = 0x21;
            pSVar20->first = true;
            pSVar20 = pSVar20 + 1;
            lVar21 = lVar21 + 1;
            __dest = pSVar10;
            _Var17._M_p = local_190._M_p;
          } while (lVar21 != 0);
          for (; _Var17._M_p != pSVar5; _Var17._M_p = _Var17._M_p + 1) {
            memcpy(__dest,_Var17._M_p,0x248);
            anon_unknown_6::ScanLineProcess::~ScanLineProcess((ScanLineProcess *)_Var17._M_p);
            __dest = __dest + 1;
          }
          if (local_190._M_p != (pointer)0x0) {
            operator_delete(local_190._M_p,(long)local_180 - (long)local_190._M_p);
          }
          local_180 = pSVar10 + local_200;
          local_190._M_p = pSVar10;
          pSVar20 = pSVar10 + uVar18;
        }
      }
      pSStack_188 = pSVar20;
      uVar22 = 0;
      _Var17._M_p = local_190._M_p;
      do {
        pSVar10 = (pointer)0x0;
        if (uVar3 - 1 != uVar22) {
          pSVar10 = _Var17._M_p + 1;
        }
        (_Var17._M_p)->next = pSVar10;
        uVar22 = uVar22 + 1;
        _Var17._M_p = _Var17._M_p + 1;
      } while (uVar18 != uVar22);
      LOCK();
      aStack_178._M_b._M_p = (__base_type)(__base_type)local_190._M_p;
      UNLOCK();
      IlmThread_3_4::TaskGroup::TaskGroup((TaskGroup *)local_220);
      do {
        iVar8 = exr_read_scanline_chunk_info
                          (*(this->_ctxt->_ctxt).
                            super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,this->partNumber,outfb,&local_1f8);
        if (iVar8 != 0) {
          this_02 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::InputExc::InputExc(this_02,"Unable to query scanline information");
          __cxa_throw(this_02,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
        }
        this_01 = (Task *)operator_new(0x38);
        IlmThread_3_4::Task::Task(this_01,(TaskGroup *)local_220);
        *(undefined ***)this_01 = &PTR__LineBufferTask_001e6068;
        *(FrameBuffer **)(this_01 + 0x10) = fb;
        *(Data **)(this_01 + 0x18) = this;
        *(int *)(this_01 + 0x20) = (int)outfb;
        *(int *)(this_01 + 0x24) = scanLine1;
        IlmThread_3_4::Semaphore::wait();
        aVar11._M_b._M_p = aStack_178._M_b._M_p;
        do {
          _Var17 = aVar11._M_b._M_p;
          if (_Var17._M_p == (pointer)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"GACK: serious failure case???",0x1d);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
            std::ostream::put(' ');
            std::ostream::flush();
          }
          LOCK();
          bVar23 = (__base_type)_Var17._M_p != aStack_178._M_b._M_p;
          aVar11._M_b._M_p = (__base_type)(__base_type)_Var17._M_p;
          aVar7._M_b._M_p = (__base_type)(__base_type)(_Var17._M_p)->next;
          if (bVar23) {
            aVar11._M_b._M_p = aStack_178._M_b._M_p;
            aVar7._M_b._M_p = aStack_178._M_b._M_p;
          }
          aStack_178._M_b._M_p = aVar7._M_b._M_p;
          UNLOCK();
        } while (bVar23);
        *(__pointer_type *)(this_01 + 0x28) = _Var17._M_p;
        *(undefined1 **)(this_01 + 0x30) = local_1b8;
        ((_Var17._M_p)->cinfo).sample_count_data_offset = local_1c8;
        ((_Var17._M_p)->cinfo).sample_count_table_size = uStack_1c0;
        ((_Var17._M_p)->cinfo).packed_size = local_1d8;
        ((_Var17._M_p)->cinfo).unpacked_size = uStack_1d0;
        ((_Var17._M_p)->cinfo).width = (undefined4)local_1e8;
        ((_Var17._M_p)->cinfo).level_x = local_1e8._4_1_;
        ((_Var17._M_p)->cinfo).level_y = local_1e8._5_1_;
        ((_Var17._M_p)->cinfo).type = local_1e8._6_1_;
        ((_Var17._M_p)->cinfo).compression = local_1e8._7_1_;
        ((_Var17._M_p)->cinfo).data_offset = uStack_1e0;
        ((_Var17._M_p)->cinfo).idx = local_1f8;
        ((_Var17._M_p)->cinfo).start_x = uStack_1f4;
        ((_Var17._M_p)->cinfo).start_y = iStack_1f0;
        ((_Var17._M_p)->cinfo).height = uStack_1ec;
        IlmThread_3_4::ThreadPool::addGlobalTask(this_01);
        outfb = (FrameBuffer *)(ulong)(iStack_1f0 + 1U);
      } while ((int)(iStack_1f0 + 1U) <= scanLine1);
      IlmThread_3_4::TaskGroup::~TaskGroup((TaskGroup *)local_220);
      aVar6._M_b._M_p = local_170._M_b._M_p;
      LOCK();
      local_170._M_b._M_p = (__base_type)(__pointer_type)0x0;
      UNLOCK();
      if (aVar6._M_b._M_p == (__pointer_type)0x0) {
        IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true>::
        ~ProcessGroup((ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true> *)
                      local_1b8);
        return;
      }
      local_220[0] = local_210;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_220,*(long *)aVar6._M_b._M_p,
                 *(size_type *)((long)aVar6._M_b._M_p + 8) + *(long *)aVar6._M_b._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(long **)aVar6._M_b._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)aVar6._M_b._M_p + 0x10)) {
        operator_delete(*(long **)aVar6._M_b._M_p,
                        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)((long)aVar6._M_b._M_p + 0x10))->_M_allocated_capacity + 1);
      }
      operator_delete((void *)aVar6._M_b._M_p,0x20);
      pIVar15 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(pIVar15,(string *)local_220);
      __cxa_throw(pIVar15,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
  }
  __mutex = &this->_mx;
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  if ((this->singleScan)._M_t.
      super___uniq_ptr_impl<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
      ._M_t.
      super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
      .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>._M_head_impl
      == (ScanLineProcess *)0x0) {
    __s.
    super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
    .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
          )operator_new(0x248);
    memset((void *)__s.
                   super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                   .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>.
                   _M_head_impl,0,0x248);
    *(undefined4 *)
     __s.
     super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
     .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>._M_head_impl =
         0x21;
    *(bool *)((long)__s.
                    super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                    .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>
                    ._M_head_impl + 4) = true;
    local_1b8._0_8_ =
         __s.
         super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
         .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>.
         _M_head_impl;
  }
  else {
    local_1b8._0_8_ =
         (this->singleScan)._M_t.
         super___uniq_ptr_impl<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
         ._M_t.
         super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
         .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>.
         _M_head_impl;
    (this->singleScan)._M_t.
    super___uniq_ptr_impl<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
    ._M_t.
    super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
    .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>._M_head_impl =
         (ScanLineProcess *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  uVar4 = local_1b8._0_8_;
  p_Var1 = (_exr_decode_pipeline *)(local_1b8._0_8_ + 0x48);
  peVar2 = (exr_chunk_info_t *)(local_1b8._0_8_ + 8);
  do {
    iVar8 = exr_read_scanline_chunk_info
                      (*(this->_ctxt->_ctxt).
                        super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       ,this->partNumber,outfb,&local_1f8);
    if (iVar8 != 0) {
      pIVar15 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::InputExc::InputExc((InputExc *)pIVar15,"Unable to query scanline information");
      pcVar16 = Iex_3_4::InputExc::~InputExc;
      puVar19 = &Iex_3_4::InputExc::typeinfo;
LAB_0019e089:
      __cxa_throw(pIVar15,puVar19,pcVar16);
    }
    if (((*(bool *)(uVar4 + 4) == false) && (((exr_chunk_info_t *)(uVar4 + 8))->idx == local_1f8))
       && (*(int *)uVar4 == 0)) {
      filllist = (vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *)(ulong)(uint)scanLine1;
      anon_unknown_6::ScanLineProcess::update_pointers
                ((ScanLineProcess *)uVar4,fb,(int)outfb,scanLine1);
      if ((*(uint64_t *)(uVar4 + 0x90) != 0) &&
         (*(_func_exr_result_t__exr_decode_pipeline_ptr **)(uVar4 + 0x148) !=
          (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0)) {
        eVar9 = (**(_func_exr_result_t__exr_decode_pipeline_ptr **)(uVar4 + 0x148))(p_Var1);
        *(exr_result_t *)uVar4 = eVar9;
        if (eVar9 != 0) {
          pIVar15 = (IoExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::IoExc::IoExc(pIVar15,"Unable to run decoder");
          pcVar16 = Iex_3_4::IoExc::~IoExc;
          puVar19 = &Iex_3_4::IoExc::typeinfo;
          goto LAB_0019e089;
        }
      }
      anon_unknown_6::ScanLineProcess::run_fill
                ((ScanLineProcess *)uVar4,outfb,(int)&this->fill_list,filllist);
    }
    else {
      *(uint64_t *)(uVar4 + 0x38) = local_1c8;
      *(uint64_t *)(uVar4 + 0x40) = uStack_1c0;
      *(uint64_t *)(uVar4 + 0x28) = local_1d8;
      *(uint64_t *)(uVar4 + 0x30) = uStack_1d0;
      *(undefined8 *)(uVar4 + 0x18) = local_1e8;
      *(uint64_t *)(uVar4 + 0x20) = uStack_1e0;
      peVar2->idx = local_1f8;
      peVar2->start_x = uStack_1f4;
      *(ulong *)(uVar4 + 0x10) = CONCAT44(uStack_1ec,iStack_1f0);
      anon_unknown_6::ScanLineProcess::run_decode
                ((ScanLineProcess *)uVar4,
                 *(this->_ctxt->_ctxt).
                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 this->partNumber,fb,(int)outfb,scanLine1,&this->fill_list);
    }
    outfb = (FrameBuffer *)(ulong)(iStack_1f0 + 1U);
    if (scanLine1 < (int)(iStack_1f0 + 1U)) {
      iVar8 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      uVar4 = local_1b8._0_8_;
      if (iVar8 == 0) {
        local_1b8._0_8_ =
             (__uniq_ptr_impl<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
              )0x0;
        this_00 = (this->singleScan)._M_t.
                  super___uniq_ptr_impl<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                  .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>.
                  _M_head_impl;
        (this->singleScan)._M_t.
        super___uniq_ptr_impl<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
        ._M_t.
        super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
        .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>.
        _M_head_impl = (ScanLineProcess *)uVar4;
        if (this_00 != (ScanLineProcess *)0x0) {
          anon_unknown_6::ScanLineProcess::~ScanLineProcess(this_00);
          operator_delete(this_00,0x248);
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        std::
        unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
        ::~unique_ptr((unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                       *)local_1b8);
        return;
      }
      std::__throw_system_error(iVar8);
    }
  } while( true );
}

Assistant:

void ScanLineInputFile::Data::readPixels (
    const FrameBuffer &fb, int scanLine1, int scanLine2)
{
    exr_attr_box2i_t dw = _ctxt->dataWindow (partNumber);
    exr_chunk_info_t cinfo;
    int32_t          scansperchunk = 1;

    if (EXR_ERR_SUCCESS != exr_get_scanlines_per_chunk (*_ctxt, partNumber, &scansperchunk))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error querying scanline counts from image "
            "file \"" << _ctxt->fileName () << "\".");
    }

    if (scanLine2 < scanLine1)
        std::swap (scanLine1, scanLine2);

    if (scanLine1 < dw.min.y || scanLine2 > dw.max.y)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Tried to read scan line outside "
            "the image file's data window: "
            << scanLine1 << " - " << scanLine2
            << " vs datawindow "
            << dw.min.y << " - " << dw.max.y);
    }

#if ILMTHREAD_THREADING_ENABLED
    int64_t nchunks;
    nchunks = ((int64_t) scanLine2 - (int64_t) scanLine1);
    nchunks /= (int64_t) scansperchunk;
    nchunks += 1;

    if (nchunks > 1 && numThreads > 1)
    {
        // we need the lifetime of this to last longer than the
        // lifetime of the task group below such that we don't get use
        // after free type error, so use scope rules to accomplish
        // this
        ScanLineProcessGroup sg (numThreads);

        {
            ILMTHREAD_NAMESPACE::TaskGroup tg;

            for (int y = scanLine1; y <= scanLine2; )
            {
                if (EXR_ERR_SUCCESS != exr_read_scanline_chunk_info (*_ctxt, partNumber, y, &cinfo))
                    throw IEX_NAMESPACE::InputExc ("Unable to query scanline information");

                ILMTHREAD_NAMESPACE::ThreadPool::addGlobalTask (
                    new LineBufferTask (&tg, this, &sg, &fb, cinfo, y, scanLine2) );

                y += scansperchunk - (y - cinfo.start_y);
            }
        }

        sg.throw_on_failure ();
    }
    else
#endif
    {
        std::unique_ptr<ScanLineProcess> sp = checkoutScan ();

        for (int y = scanLine1; y <= scanLine2; )
        {
            if (EXR_ERR_SUCCESS != exr_read_scanline_chunk_info (*_ctxt, partNumber, y, &cinfo))
                throw IEX_NAMESPACE::InputExc ("Unable to query scanline information");

            // check if we have the same chunk where we can just
            // re-run the unpack (i.e. people reading 1 scan at a time
            // in a multi-scanline chunk)
            if (!sp->first && sp->cinfo.idx == cinfo.idx &&
                sp->last_decode_err == EXR_ERR_SUCCESS)
            {
                sp->run_unpack (
                    *_ctxt,
                    partNumber,
                    &fb,
                    y,
                    scanLine2,
                    fill_list);
            }
            else
            {
                sp->cinfo = cinfo;
                sp->run_decode (
                    *_ctxt,
                    partNumber,
                    &fb,
                    y,
                    scanLine2,
                    fill_list);
            }

            y += scansperchunk - (y - cinfo.start_y);
        }

        checkinScan (sp);
    }
}